

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall
QGraphicsPathItem::QGraphicsPathItem
          (QGraphicsPathItem *this,QPainterPath *path,QGraphicsItem *parent)

{
  undefined1 *puVar1;
  char cVar2;
  QGraphicsItemPrivate *pQVar3;
  long lVar4;
  qreal *pqVar5;
  QTransform *pQVar6;
  byte bVar7;
  
  bVar7 = 0;
  pQVar3 = (QGraphicsItemPrivate *)operator_new(0x1b0);
  pQVar3->_vptr_QGraphicsItemPrivate = (_func_int **)&PTR__QGraphicsItemPrivate_0081f428;
  (pQVar3->extras).d.d = (Data *)0x0;
  (pQVar3->extras).d.ptr = (ExtraStruct *)0x0;
  (pQVar3->extras).d.size = 0;
  (pQVar3->childrenBoundingRect).xp = 0.0;
  (pQVar3->childrenBoundingRect).yp = 0.0;
  (pQVar3->childrenBoundingRect).w = 0.0;
  (pQVar3->childrenBoundingRect).h = 0.0;
  (pQVar3->needsRepaint).xp = 0.0;
  (pQVar3->needsRepaint).yp = 0.0;
  (pQVar3->needsRepaint).w = 0.0;
  (pQVar3->needsRepaint).h = 0.0;
  (pQVar3->paintedViewBoundingRects).d = (Data *)0x0;
  (pQVar3->pos).xp = 0.0;
  (pQVar3->pos).yp = 0.0;
  pQVar3->z = 0.0;
  pQVar3->opacity = 1.0;
  pQVar3->scene = (QGraphicsScene *)0x0;
  pQVar3->parent = (QGraphicsItem *)0x0;
  (pQVar3->children).d.d = (Data *)0x0;
  (pQVar3->children).d.ptr = (QGraphicsItem **)0x0;
  (pQVar3->children).d.size = 0;
  pQVar3->transformData = (TransformData *)0x0;
  pQVar3->graphicsEffect = (QGraphicsEffect *)0x0;
  pqVar5 = (qreal *)&DAT_00700e28;
  pQVar6 = &pQVar3->sceneTransform;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    pQVar6->m_matrix[0][0] = *pqVar5;
    pqVar5 = pqVar5 + (ulong)bVar7 * -2 + 1;
    pQVar6 = (QTransform *)((long)pQVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  puVar1 = &(pQVar3->sceneTransform).field_0x48;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
  pQVar3->index = -1;
  pQVar3->siblingIndex = -1;
  pQVar3->itemDepth = -1;
  pQVar3->focusProxy = (QGraphicsItem *)0x0;
  (pQVar3->focusProxyRefs).d.d = (Data *)0x0;
  (pQVar3->focusProxyRefs).d.ptr = (QGraphicsItem ***)0x0;
  (pQVar3->focusProxyRefs).d.size = 0;
  pQVar3->subFocusItem = (QGraphicsItem *)0x0;
  pQVar3->focusScopeItem = (QGraphicsItem *)0x0;
  pQVar3->imHints = (QFlagsStorageHelper<Qt::InputMethodHint,_4>)0x0;
  pQVar3->panelModality = NonModal;
  (pQVar3->gestureContext).d.d.ptr =
       (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
        *)0x0;
  *(undefined8 *)&pQVar3->field_0x160 = 0x600000000000bf;
  *(uint *)&pQVar3->field_0x168 = *(uint *)&pQVar3->field_0x168 & 0xfffff000 | 0x822;
  pQVar3->globalStackingOrder = -1;
  pQVar3->q_ptr = (QGraphicsItem *)0x0;
  pQVar3->_vptr_QGraphicsItemPrivate =
       (_func_int **)&PTR__QAbstractGraphicsShapeItemPrivate_00820888;
  QBrush::QBrush((QBrush *)(pQVar3 + 1));
  QPen::QPen((QPen *)&pQVar3[1].extras);
  pQVar3[1].childrenBoundingRect.xp = 0.0;
  pQVar3[1].childrenBoundingRect.yp = 0.0;
  pQVar3[1].extras.d.ptr = (ExtraStruct *)0x0;
  pQVar3[1].extras.d.size = 0;
  pQVar3->_vptr_QGraphicsItemPrivate = (_func_int **)&PTR__QGraphicsPathItemPrivate_00820938;
  QPainterPath::QPainterPath((QPainterPath *)&pQVar3[1].childrenBoundingRect.w);
  (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem._vptr_QGraphicsItem =
       (_func_int **)&PTR__QGraphicsPixmapItem_0081f4c0;
  (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem.d_ptr.d = pQVar3;
  pQVar3->q_ptr = (QGraphicsItem *)this;
  QGraphicsItem::setParentItem((QGraphicsItem *)this,parent);
  (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem._vptr_QGraphicsItem =
       (_func_int **)&PTR__QGraphicsPixmapItem_0081f8d8;
  cVar2 = QPainterPath::isEmpty();
  if (cVar2 != '\0') {
    return;
  }
  setPath(this,path);
  return;
}

Assistant:

QGraphicsPathItem::QGraphicsPathItem(const QPainterPath &path,
                                     QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsPathItemPrivate, parent)
{
    if (!path.isEmpty())
        setPath(path);
}